

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O1

int png_sig_cmp(png_const_bytep sig,size_t start,size_t num_to_check)

{
  int iVar1;
  size_t sVar2;
  size_t __n;
  
  sVar2 = 8;
  if (((8 < num_to_check) || (sVar2 = num_to_check, num_to_check != 0)) && (start < 8)) {
    __n = 8 - start;
    if (sVar2 + start < 9) {
      __n = sVar2;
    }
    iVar1 = memcmp(sig + start,&DAT_0012e1d0 + start,__n);
    return iVar1;
  }
  return -1;
}

Assistant:

int PNGAPI
png_sig_cmp(png_const_bytep sig, size_t start, size_t num_to_check)
{
   png_byte png_signature[8] = {137, 80, 78, 71, 13, 10, 26, 10};

   if (num_to_check > 8)
      num_to_check = 8;

   else if (num_to_check < 1)
      return (-1);

   if (start > 7)
      return (-1);

   if (start + num_to_check > 8)
      num_to_check = 8 - start;

   return ((int)(memcmp(&sig[start], &png_signature[start], num_to_check)));
}